

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O2

size_t uWS::protocol::formatMessage<true>
                 (char *dst,char *src,size_t length,OpCode opCode,size_t reportedLength,
                 bool compressed)

{
  unsigned_long uVar1;
  void *pvVar2;
  long lStack_30;
  
  if (reportedLength < 0x7e) {
    dst[1] = (char)reportedLength;
    lStack_30 = 2;
  }
  else if (reportedLength < 0x10000) {
    dst[1] = '~';
    *(ushort *)(dst + 2) = (ushort)reportedLength << 8 | (ushort)reportedLength >> 8;
    lStack_30 = 4;
  }
  else {
    dst[1] = '\x7f';
    uVar1 = cond_byte_swap<unsigned_long>(reportedLength);
    *(unsigned_long *)(dst + 2) = uVar1;
    lStack_30 = 10;
  }
  *dst = compressed << 6 | opCode | 0x80;
  pvVar2 = memcpy(dst + lStack_30,src,length);
  return (size_t)pvVar2;
}

Assistant:

static inline size_t formatMessage(char *dst, const char *src, size_t length, OpCode opCode, size_t reportedLength, bool compressed) {
    size_t messageLength;
    size_t headerLength;
    if (reportedLength < 126) {
        headerLength = 2;
        dst[1] = (char) reportedLength;
    } else if (reportedLength <= UINT16_MAX) {
        headerLength = 4;
        dst[1] = 126;
        uint16_t tmp = cond_byte_swap<uint16_t>((uint16_t) reportedLength);
        memcpy(&dst[2], &tmp, sizeof(uint16_t));
    } else {
        headerLength = 10;
        dst[1] = 127;
        uint64_t tmp = cond_byte_swap<uint64_t>((uint64_t) reportedLength);
        memcpy(&dst[2], &tmp, sizeof(uint64_t));
    }

    int flags = 0;
    dst[0] = (char) ((flags & SND_NO_FIN ? 0 : 128) | (compressed ? SND_COMPRESSED : 0));
    if (!(flags & SND_CONTINUATION)) {
        dst[0] |= (char) opCode;
    }

    char mask[4];
    if (!isServer) {
        dst[1] |= 0x80;
        uint32_t random = rand();
        memcpy(mask, &random, 4);
        memcpy(dst + headerLength, &random, 4);
        headerLength += 4;
    }

    messageLength = headerLength + length;
    memcpy(dst + headerLength, src, length);

    if (!isServer) {

        // overwrites up to 3 bytes outside of the given buffer!
        //WebSocketProtocol<isServer>::unmaskInplace(dst + headerLength, dst + headerLength + length, mask);

        // this is not optimal
        char *start = dst + headerLength;
        char *stop = start + length;
        int i = 0;
        while (start != stop) {
            (*start++) ^= mask[i++ % 4];
        }
    }
    return messageLength;
}